

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O1

void fight_prog_geulgon(CHAR_DATA *mob,CHAR_DATA *victim)

{
  CHAR_DATA *bch;
  CHAR_DATA *pCVar1;
  CHAR_DATA *ach;
  bool bVar2;
  int iVar3;
  
  if ((victim != (CHAR_DATA *)0x0) && (mob->fighting != (CHAR_DATA *)0x0)) {
    bch = mob->master;
    iVar3 = number_percent();
    if (0x4a < iVar3) {
      iVar3 = number_range(1,5);
      if (iVar3 - 2U < 2) {
        iVar3 = skill_lookup("vampiric touch");
        spell_vampiric_touch(iVar3,(int)mob->level,mob,victim,1);
        return;
      }
      if (iVar3 - 4U < 2) {
        pCVar1 = mob->in_room->people;
        while (ach = pCVar1, ach != (CHAR_DATA *)0x0) {
          pCVar1 = ach->next_in_room;
          bVar2 = is_same_group(ach,bch);
          if (((!bVar2) && ((bch->cabal < 1 || (bch->cabal != ach->cabal)))) &&
             ((bVar2 = is_safe(bch,ach), !bVar2 ||
              (ach->fighting == bch || ach->fighting == (CHAR_DATA *)0x0)))) {
            iVar3 = skill_lookup("iceball");
            spell_iceball(iVar3,(int)mob->level,mob,ach,0);
          }
        }
      }
      else if (iVar3 == 1) {
        iVar3 = skill_lookup("energy drain");
        spell_energy_drain(iVar3,(int)mob->level,mob,victim,1);
        return;
      }
    }
  }
  return;
}

Assistant:

void fight_prog_geulgon(CHAR_DATA *mob, CHAR_DATA *victim)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	CHAR_DATA *ch = mob->master;
	if (mob->fighting == nullptr)
		return;

	if (!victim)
		return;

	if (number_percent() < 75)
		return;

	switch (number_range(1, 5))
	{
		case 1:
			spell_energy_drain(skill_lookup("energy drain"), mob->level, mob, victim, TAR_CHAR_OFFENSIVE);
			break;
		case 2:
		case 3:
			spell_vampiric_touch(skill_lookup("vampiric touch"), mob->level, mob, victim, TAR_CHAR_OFFENSIVE);
			break;
		case 4:
		case 5:
			for (vch = mob->in_room->people; vch != nullptr; vch = vch_next)
			{
				vch_next = vch->next_in_room;

				if (is_same_group(vch, ch))
					continue;

				if (ch->cabal > 0 && ch->cabal == vch->cabal)
					continue;

				if (is_safe(ch, vch) && vch->fighting != nullptr && vch->fighting != ch)
					continue;

				spell_iceball(skill_lookup("iceball"), mob->level, mob, vch, TAR_IGNORE);
			}

			break;
	}
}